

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001bdfe0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001bdfe7._0_1_ = '-';
    uRam00000000001bdfe7._1_1_ = '-';
    uRam00000000001bdfe7._2_1_ = '-';
    uRam00000000001bdfe7._3_1_ = '-';
    uRam00000000001bdfe7._4_1_ = '-';
    uRam00000000001bdfe7._5_1_ = '-';
    uRam00000000001bdfe7._6_1_ = '-';
    uRam00000000001bdfe7._7_1_ = '-';
    DAT_001bdfd0 = '-';
    DAT_001bdfd0_1._0_1_ = '-';
    DAT_001bdfd0_1._1_1_ = '-';
    DAT_001bdfd0_1._2_1_ = '-';
    DAT_001bdfd0_1._3_1_ = '-';
    DAT_001bdfd0_1._4_1_ = '-';
    DAT_001bdfd0_1._5_1_ = '-';
    DAT_001bdfd0_1._6_1_ = '-';
    uRam00000000001bdfd8 = 0x2d2d2d2d2d2d2d;
    DAT_001bdfdf = 0x2d;
    DAT_001bdfc0 = '-';
    DAT_001bdfc0_1._0_1_ = '-';
    DAT_001bdfc0_1._1_1_ = '-';
    DAT_001bdfc0_1._2_1_ = '-';
    DAT_001bdfc0_1._3_1_ = '-';
    DAT_001bdfc0_1._4_1_ = '-';
    DAT_001bdfc0_1._5_1_ = '-';
    DAT_001bdfc0_1._6_1_ = '-';
    uRam00000000001bdfc8._0_1_ = '-';
    uRam00000000001bdfc8._1_1_ = '-';
    uRam00000000001bdfc8._2_1_ = '-';
    uRam00000000001bdfc8._3_1_ = '-';
    uRam00000000001bdfc8._4_1_ = '-';
    uRam00000000001bdfc8._5_1_ = '-';
    uRam00000000001bdfc8._6_1_ = '-';
    uRam00000000001bdfc8._7_1_ = '-';
    DAT_001bdfb0 = '-';
    DAT_001bdfb0_1._0_1_ = '-';
    DAT_001bdfb0_1._1_1_ = '-';
    DAT_001bdfb0_1._2_1_ = '-';
    DAT_001bdfb0_1._3_1_ = '-';
    DAT_001bdfb0_1._4_1_ = '-';
    DAT_001bdfb0_1._5_1_ = '-';
    DAT_001bdfb0_1._6_1_ = '-';
    uRam00000000001bdfb8._0_1_ = '-';
    uRam00000000001bdfb8._1_1_ = '-';
    uRam00000000001bdfb8._2_1_ = '-';
    uRam00000000001bdfb8._3_1_ = '-';
    uRam00000000001bdfb8._4_1_ = '-';
    uRam00000000001bdfb8._5_1_ = '-';
    uRam00000000001bdfb8._6_1_ = '-';
    uRam00000000001bdfb8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001bdfa8._0_1_ = '-';
    uRam00000000001bdfa8._1_1_ = '-';
    uRam00000000001bdfa8._2_1_ = '-';
    uRam00000000001bdfa8._3_1_ = '-';
    uRam00000000001bdfa8._4_1_ = '-';
    uRam00000000001bdfa8._5_1_ = '-';
    uRam00000000001bdfa8._6_1_ = '-';
    uRam00000000001bdfa8._7_1_ = '-';
    DAT_001bdfef = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}